

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreprocessorTests.cpp
# Opt level: O0

TokenKind lexDefaultNetType(string_view text)

{
  StringRef capturedExpression;
  StringRef macroName;
  TokenKind TVar1;
  ExprLhs<slang::parsing::Token_&> expr;
  Token TVar2;
  Bag *in_stack_00000048;
  Diagnostics *in_stack_00000050;
  BumpAllocator *in_stack_00000058;
  SourceManager *in_stack_00000060;
  Preprocessor *in_stack_00000068;
  AssertionHandler catchAssertionHandler;
  Token token;
  Preprocessor preprocessor;
  SourceLineInfo *lineInfo;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  undefined6 in_stack_fffffffffffffb10;
  undefined2 in_stack_fffffffffffffb16;
  char *in_stack_fffffffffffffb18;
  AssertionHandler *this;
  Flags resultDisposition;
  SourceLineInfo local_480;
  Preprocessor *in_stack_fffffffffffffba0;
  string_view in_stack_fffffffffffffba8;
  string_view in_stack_fffffffffffffbb8;
  size_t local_3e8;
  Preprocessor *pPStack_3e0;
  Preprocessor local_3a8;
  
  slang::SmallVectorBase<slang::Diagnostic>::clear(in_stack_fffffffffffffb00);
  getSourceManager();
  slang::Bag::Bag((Bag *)0x63acaf);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x63acbc);
  slang::parsing::Preprocessor::Preprocessor
            (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000048,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             preprocessor.options._104_16_);
  slang::Bag::~Bag((Bag *)0x63acfc);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT26(in_stack_fffffffffffffb16,in_stack_fffffffffffffb10),in_stack_fffffffffffffb08
            );
  slang::parsing::Preprocessor::pushSource
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffba8);
  TVar2 = slang::parsing::Preprocessor::next((Preprocessor *)0x63ad5c);
  resultDisposition = TVar2._0_4_;
  local_480 = (SourceLineInfo)operator____catch_sr((char *)pPStack_3e0,local_3e8);
  this = (AssertionHandler *)&stack0xfffffffffffffb70;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/PreprocessorTests.cpp"
             ,0x504);
  operator____catch_sr((char *)pPStack_3e0,local_3e8);
  lineInfo = (SourceLineInfo *)CONCAT44((int)(local_3e8 >> 0x20),1);
  macroName.m_size = (size_type)this;
  macroName.m_start = in_stack_fffffffffffffb18;
  capturedExpression.m_size._0_6_ = in_stack_fffffffffffffb10;
  capturedExpression.m_start = in_stack_fffffffffffffb08;
  capturedExpression.m_size._6_2_ = in_stack_fffffffffffffb16;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)pPStack_3e0,macroName,lineInfo,capturedExpression,resultDisposition
            );
  expr = Catch::operator<=<slang::parsing::Token_&,_0>((Decomposer *)lineInfo,(Token *)0x63ae22);
  Catch::AssertionHandler::handleExpr<slang::parsing::Token&>
            (this,(ExprLhs<slang::parsing::Token_&> *)expr.m_lhs);
  Catch::AssertionHandler::complete((AssertionHandler *)pPStack_3e0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)pPStack_3e0);
  TVar1 = slang::parsing::Preprocessor::getDefaultNetType(&local_3a8);
  slang::parsing::Preprocessor::~Preprocessor(pPStack_3e0);
  return TVar1;
}

Assistant:

TokenKind lexDefaultNetType(std::string_view text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Token token = preprocessor.next();
    REQUIRE(token);
    return preprocessor.getDefaultNetType();
}